

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt_image::get_block_pixels
          (dxt_image *this,uint block_x,uint block_y,color_quad_u8 *pPixels)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  element *peVar5;
  uchar *puVar6;
  color_quad<unsigned_char,_int> *local_d8;
  uint local_b8;
  uint a;
  uint i_2;
  int comp_index_1;
  dxt3_block *pDXT3_block;
  uint local_a0;
  uint s_1;
  uint i_1;
  int comp_index;
  uint values [8];
  dxt5_block *pDXT5_block;
  uint s;
  uint i;
  color_quad_u8 colors [4];
  dxt1_block *pDXT1_block;
  etc1_block *block_2;
  etc1_block *block_1;
  etc1_block *block;
  dxt5_block *pdStack_30;
  uint element_index;
  element *pElement;
  bool success;
  color_quad_u8 *pPixels_local;
  uint block_y_local;
  uint block_x_local;
  dxt_image *this_local;
  
  pElement._7_1_ = true;
  pdStack_30 = (dxt5_block *)get_element(this,block_x,block_y,0);
  for (block._4_4_ = 0; block._4_4_ < this->m_num_elements_per_block; block._4_4_ = block._4_4_ + 1)
  {
    switch(this->m_element_type[block._4_4_]) {
    case cColorDXT1:
      colors._8_8_ = pdStack_30;
      local_d8 = (color_quad<unsigned_char,_int> *)&s;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_d8);
        local_d8 = local_d8 + 1;
      } while (local_d8 != colors + 2);
      uVar3 = dxt1_block::get_low_color((dxt1_block *)colors._8_8_);
      uVar4 = dxt1_block::get_high_color((dxt1_block *)colors._8_8_);
      dxt1_block::get_block_colors((color_quad_u8 *)&s,(uint16)uVar3,(uint16)uVar4);
      for (pDXT5_block._4_4_ = 0; pDXT5_block._4_4_ < 0x10;
          pDXT5_block._4_4_ = pDXT5_block._4_4_ + 1) {
        uVar3 = dxt1_block::get_selector
                          ((dxt1_block *)colors._8_8_,pDXT5_block._4_4_ & 3,pDXT5_block._4_4_ >> 2);
        pPixels[pDXT5_block._4_4_].field_0.field_0.r = (uchar)(&s)[uVar3];
        pPixels[pDXT5_block._4_4_].field_0.field_0.g = *(uchar *)((long)&s + (ulong)uVar3 * 4 + 1);
        pPixels[pDXT5_block._4_4_].field_0.field_0.b = *(uchar *)((long)&s + (ulong)uVar3 * 4 + 2);
        if (this->m_format < cDXT3) {
          pPixels[pDXT5_block._4_4_].field_0.field_0.a = *(uchar *)((long)&s + (ulong)uVar3 * 4 + 3)
          ;
        }
      }
      break;
    case cAlphaDXT3:
      cVar1 = this->m_element_component_index[block._4_4_];
      for (local_b8 = 0; local_b8 < 0x10; local_b8 = local_b8 + 1) {
        uVar3 = dxt3_block::get_alpha((dxt3_block *)pdStack_30,local_b8 & 3,local_b8 >> 2,true);
        puVar6 = color_quad<unsigned_char,_int>::operator[](pPixels + local_b8,(int)cVar1);
        *puVar6 = (uchar)uVar3;
      }
      break;
    case cAlphaDXT5:
      values._24_8_ = pdStack_30;
      uVar3 = dxt5_block::get_low_alpha(pdStack_30);
      uVar4 = dxt5_block::get_high_alpha((dxt5_block *)values._24_8_);
      dxt5_block::get_block_values(&i_1,uVar3,uVar4);
      cVar1 = this->m_element_component_index[block._4_4_];
      for (local_a0 = 0; local_a0 < 0x10; local_a0 = local_a0 + 1) {
        uVar3 = dxt5_block::get_selector((dxt5_block *)values._24_8_,local_a0 & 3,local_a0 >> 2);
        uVar3 = (&i_1)[uVar3];
        puVar6 = color_quad<unsigned_char,_int>::operator[](pPixels + local_a0,(int)cVar1);
        *puVar6 = (uchar)uVar3;
      }
      break;
    case cColorETC1:
      peVar5 = get_element(this,block_x,block_y,block._4_4_);
      bVar2 = rg_etc1::unpack_etc1_block(peVar5,(uint *)pPixels,this->m_format != cETC1);
      if (!bVar2) {
        pElement._7_1_ = false;
      }
      break;
    case cColorETC2:
      peVar5 = get_element(this,block_x,block_y,block._4_4_);
      bVar2 = rg_etc1::unpack_etc2_color(peVar5,(uint *)pPixels,this->m_format != cETC2);
      if (!bVar2) {
        pElement._7_1_ = false;
      }
      break;
    case cAlphaETC2:
      peVar5 = get_element(this,block_x,block_y,block._4_4_);
      bVar2 = rg_etc1::unpack_etc2_alpha
                        (peVar5,(uint *)pPixels,(int)this->m_element_component_index[block._4_4_]);
      if (!bVar2) {
        pElement._7_1_ = false;
      }
    }
    pdStack_30 = pdStack_30 + 1;
  }
  return pElement._7_1_;
}

Assistant:

bool dxt_image::get_block_pixels(uint block_x, uint block_y, color_quad_u8* pPixels) const
    {
        bool success = true;
        const element* pElement = &get_element(block_x, block_y, 0);

        for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
        {
            switch (m_element_type[element_index])
            {
            case cColorETC1:
            {
                const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
// Preserve alpha if the format is something weird (like ETC1 for color and DXT5A for alpha) - which isn't currently supported.
#if CRNLIB_USE_RG_ETC1
                if (!rg_etc1::unpack_etc1_block(&block, (uint32*)pPixels, m_format != cETC1))
                {
                    success = false;
                }
#else
                if (!unpack_etc1(block, pPixels, m_format != cETC1))
                {
                    success = false;
                }
#endif

                break;
            }
            case cColorETC2:
            {
                const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
                if (!rg_etc1::unpack_etc2_color(&block, (uint32*)pPixels, m_format != cETC2))
                {
                    success = false;
                }
                break;
            }
            case cAlphaETC2:
            {
                const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
                if (!rg_etc1::unpack_etc2_alpha(&block, (uint32*)pPixels, m_element_component_index[element_index]))
                {
                    success = false;
                }
                break;
            }
            case cColorDXT1:
            {
                const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pElement);

                color_quad_u8 colors[cDXT1SelectorValues];
                pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                {
                    uint s = pDXT1_block->get_selector(i & 3, i >> 2);

                    pPixels[i].r = colors[s].r;
                    pPixels[i].g = colors[s].g;
                    pPixels[i].b = colors[s].b;

                    if (m_format <= cDXT1A)
                    {
                        pPixels[i].a = colors[s].a;
                    }
                }

                break;
            }
            case cAlphaDXT5:
            {
                const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pElement);

                uint values[cDXT5SelectorValues];
                dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

                const int comp_index = m_element_component_index[element_index];

                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                {
                    uint s = pDXT5_block->get_selector(i & 3, i >> 2);

                    pPixels[i][comp_index] = static_cast<uint8>(values[s]);
                }

                break;
            }
            case cAlphaDXT3:
            {
                const dxt3_block* pDXT3_block = reinterpret_cast<const dxt3_block*>(pElement);

                const int comp_index = m_element_component_index[element_index];

                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                {
                    uint a = pDXT3_block->get_alpha(i & 3, i >> 2, true);

                    pPixels[i][comp_index] = static_cast<uint8>(a);
                }

                break;
            }
            default:
                break;
            }
        } // element_index
        return success;
    }